

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O2

bool __thiscall
QGraphicsAnchorLayoutPrivate::replaceVertex
          (QGraphicsAnchorLayoutPrivate *this,Orientation orientation,AnchorVertex *oldV,
          AnchorVertex *newV,QList<QtGraphicsAnchorLayout::AnchorData_*> *edges)

{
  AnchorData *newAnchor;
  AnchorData *t;
  bool bVar1;
  int i;
  ulong uVar2;
  AnchorVertex *second;
  long in_FS_OFFSET;
  bool newFeasible;
  bool local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = true;
  for (uVar2 = 0; uVar2 < (ulong)(edges->d).size; uVar2 = uVar2 + 1) {
    newAnchor = (edges->d).ptr[uVar2];
    second = newAnchor->from;
    if (second == oldV) {
      newAnchor->from = newV;
      second = newAnchor->to;
    }
    else {
      newAnchor->to = newV;
    }
    local_39 = true;
    t = addAnchorMaybeParallel(this,newAnchor,&local_39);
    bVar1 = (bool)(bVar1 & local_39);
    if (t != newAnchor) {
      QList<QtGraphicsAnchorLayout::AnchorData_*>::append
                ((QList<QtGraphicsAnchorLayout::AnchorData_*> *)
                 ((this->simplifiedVertices).m_data + (long)(int)orientation + 1),t);
    }
    Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::takeEdge
              ((this->graph).m_data + (long)(int)orientation + -1,oldV,second);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QGraphicsAnchorLayoutPrivate::replaceVertex(Qt::Orientation orientation, AnchorVertex *oldV,
                                                 AnchorVertex *newV, const QList<AnchorData *> &edges)
{
    Graph<AnchorVertex, AnchorData> &g = graph[orientation];
    bool feasible = true;

    for (int i = 0; i < edges.size(); ++i) {
        AnchorData *ad = edges[i];
        AnchorVertex *otherV = replaceVertex_helper(ad, oldV, newV);

#if defined(QT_DEBUG)
        ad->name = QString::fromLatin1("%1 --to--> %2").arg(ad->from->toString(), ad->to->toString());
#endif

        bool newFeasible;
        AnchorData *newAnchor = addAnchorMaybeParallel(ad, &newFeasible);
        feasible &= newFeasible;

        if (newAnchor != ad) {
            // A parallel was created, we mark that in the list of anchors created by vertex
            // simplification. This is needed because we want to restore them in a separate step
            // from the restoration of anchor simplification.
            anchorsFromSimplifiedVertices[orientation].append(newAnchor);
        }

        g.takeEdge(oldV, otherV);
    }

    return feasible;
}